

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_max(lua_State *L)

{
  int iVar1;
  int iVar2;
  int index1;
  int index2;
  bool bVar3;
  
  iVar1 = lua_gettop(L);
  if (iVar1 < 1) {
    luaL_argerror(L,1,"value expected");
  }
  index1 = 1;
  if (1 < iVar1) {
    index2 = 2;
    do {
      iVar2 = lua_compare(L,index1,index2,1);
      if (iVar2 != 0) {
        index1 = index2;
      }
      bVar3 = index2 != iVar1;
      index2 = index2 + 1;
    } while (bVar3);
  }
  lua_pushvalue(L,index1);
  return 1;
}

Assistant:

static int math_max(lua_State *L) {
    int n = lua_gettop(L);  /* number of arguments */
    int imax = 1;  /* index of current maximum value */
    int i;
    luaL_argcheck(L, n >= 1, 1, "value expected");
    for (i = 2; i <= n; i++) {
        if (lua_compare(L, imax, i, LUA_OPLT))
            imax = i;
    }
    lua_pushvalue(L, imax);
    return 1;
}